

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  BufferView<embree::Vec3fx> *pBVar14;
  char *pcVar15;
  size_t sVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar21;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  long lVar30;
  ulong uVar31;
  size_t *psVar32;
  undefined4 uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  float fVar80;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar84;
  float fVar85;
  undefined1 auVar83 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 in_ZMM13 [64];
  float fVar89;
  float fVar93;
  float fVar94;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  size_t local_240;
  size_t local_228;
  undefined1 local_218 [16];
  undefined1 auVar69 [64];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  aVar68.m128[2] = -INFINITY;
  aVar68._0_8_ = 0xff800000ff800000;
  aVar68.m128[3] = -INFINITY;
  auVar69 = ZEXT1664((undefined1  [16])aVar68);
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar68;
  local_218._8_4_ = 0x7f800000;
  local_218._0_8_ = 0x7f8000007f800000;
  local_218._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar68;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar35 = r->_begin;
  local_240 = __return_storage_ptr__->end;
  if (uVar35 < r->_end) {
    auVar72 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar81 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar63 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar79 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar75 = ZEXT1664((undefined1  [16])aVar68);
    local_228 = k;
    do {
      uVar13 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar35);
      uVar31 = (ulong)(uVar13 + 3);
      pBVar14 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                vertices.items;
      if (uVar31 < (pBVar14->super_RawBufferView).num) {
        uVar38 = (ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        psVar32 = &(pBVar14->super_RawBufferView).stride;
        bVar39 = false;
        uVar36 = 0;
        do {
          pcVar15 = ((RawBufferView *)(psVar32 + -2))->ptr_ofs;
          sVar16 = *psVar32;
          lVar34 = sVar16 * uVar13;
          lVar37 = sVar16 * (uVar13 + 1);
          lVar30 = sVar16 * (uVar13 + 2);
          auVar58 = vinsertps_avx(ZEXT416(*(uint *)(pcVar15 + lVar34 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar15 + lVar37 + 0xc)),0x10);
          auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(pcVar15 + lVar30 + 0xc)),0x20);
          auVar58 = vinsertps_avx(auVar58,ZEXT416(*(uint *)(pcVar15 + sVar16 * uVar31 + 0xc)),0x30);
          auVar58 = vandps_avx(auVar58,auVar72._0_16_);
          auVar43 = auVar81._0_16_;
          auVar58 = vcmpps_avx(auVar58,auVar43,5);
          if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar58[0xf] < '\0') {
LAB_012d4255:
            if (!bVar39) goto LAB_012d47eb;
            break;
          }
          auVar60 = auVar63._0_16_;
          auVar58 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar34),auVar60,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar34),auVar43,1);
          auVar58 = vandps_avx(auVar58,auVar59);
          uVar33 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar33 & 7) != 0) goto LAB_012d4255;
          auVar58 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar37),auVar60,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar37),auVar43,1);
          auVar58 = vandps_avx(auVar58,auVar59);
          uVar33 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar33 & 7) != 0) goto LAB_012d4255;
          auVar58 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar30),auVar60,6);
          auVar59 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + lVar30),auVar43,1);
          auVar58 = vandps_avx(auVar58,auVar59);
          uVar33 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar33 & 7) != 0) goto LAB_012d4255;
          auVar58 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + sVar16 * uVar31),auVar60,6);
          auVar43 = vcmpps_avx(*(undefined1 (*) [16])(pcVar15 + sVar16 * uVar31),auVar43,1);
          auVar58 = vandps_avx(auVar58,auVar43);
          uVar33 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar33 & 7) != 0) goto LAB_012d4255;
          bVar39 = uVar38 <= uVar36;
          uVar36 = uVar36 + 1;
          psVar32 = psVar32 + 7;
        } while (uVar38 + 1 != uVar36);
        pcVar15 = (pBVar14->super_RawBufferView).ptr_ofs;
        sVar16 = (pBVar14->super_RawBufferView).stride;
        lVar37 = (uVar13 + 1) * sVar16;
        lVar30 = (uVar13 + 2) * sVar16;
        lVar34 = uVar31 * sVar16;
        fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar2 = *(float *)(pcVar15 + lVar37);
        fVar3 = *(float *)(pcVar15 + lVar30);
        fVar4 = *(float *)(pcVar15 + lVar30 + 4);
        fVar5 = *(float *)(pcVar15 + lVar30 + 8);
        auVar58 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar30 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar30 + 0xc))),0);
        fVar6 = *(float *)(pcVar15 + lVar34);
        fVar7 = *(float *)(pcVar15 + lVar34 + 4);
        fVar8 = *(float *)(pcVar15 + lVar34 + 8);
        auVar43 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar34 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar34 + 0xc))),0);
        fVar80 = auVar79._28_4_;
        fVar89 = auVar43._0_4_;
        fVar93 = auVar43._4_4_;
        fVar94 = auVar43._8_4_;
        fVar82 = auVar58._0_4_;
        fVar84 = auVar58._4_4_;
        fVar85 = auVar58._8_4_;
        fVar65 = (float)bezier_basis0._2816_4_ + fVar80 + fVar6;
        fVar9 = *(float *)(pcVar15 + lVar37 + 4);
        fVar70 = (float)bezier_basis0._2816_4_ + fVar80 + auVar69._28_4_;
        fVar10 = *(float *)(pcVar15 + lVar37 + 8);
        auVar59 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar37 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar37 + 0xc))),0);
        fVar86 = auVar59._0_4_;
        fVar87 = auVar59._4_4_;
        fVar88 = auVar59._8_4_;
        lVar30 = uVar13 * sVar16;
        fVar11 = *(float *)(pcVar15 + lVar30);
        auVar90._0_4_ =
             fVar11 * (float)bezier_basis0._476_4_ +
             (float)bezier_basis0._1632_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2788_4_ + fVar6 * (float)bezier_basis0._3944_4_;
        auVar90._4_4_ =
             fVar11 * (float)bezier_basis0._480_4_ +
             (float)bezier_basis0._1636_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2792_4_ + fVar6 * (float)bezier_basis0._3948_4_;
        auVar90._8_4_ =
             fVar11 * (float)bezier_basis0._484_4_ +
             (float)bezier_basis0._1640_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2796_4_ + fVar6 * (float)bezier_basis0._3952_4_;
        auVar90._12_4_ =
             fVar11 * (float)bezier_basis0._488_4_ +
             (float)bezier_basis0._1644_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2800_4_ + fVar6 * (float)bezier_basis0._3956_4_;
        auVar90._16_4_ =
             fVar11 * (float)bezier_basis0._492_4_ +
             (float)bezier_basis0._1648_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2804_4_ + fVar6 * (float)bezier_basis0._3960_4_;
        auVar90._20_4_ =
             fVar11 * (float)bezier_basis0._496_4_ +
             (float)bezier_basis0._1652_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2808_4_ + fVar6 * (float)bezier_basis0._3964_4_;
        auVar90._24_4_ =
             fVar11 * (float)bezier_basis0._500_4_ +
             (float)bezier_basis0._1656_4_ * fVar2 +
             fVar3 * (float)bezier_basis0._2812_4_ + fVar6 * (float)bezier_basis0._3968_4_;
        auVar90._28_4_ = (float)bezier_basis0._2816_4_ + (float)bezier_basis0._3972_4_ + fVar65;
        fVar12 = *(float *)(pcVar15 + lVar30 + 4);
        auVar83._0_4_ =
             fVar12 * (float)bezier_basis0._476_4_ +
             fVar9 * (float)bezier_basis0._1632_4_ +
             fVar4 * (float)bezier_basis0._2788_4_ + fVar7 * (float)bezier_basis0._3944_4_;
        auVar83._4_4_ =
             fVar12 * (float)bezier_basis0._480_4_ +
             fVar9 * (float)bezier_basis0._1636_4_ +
             fVar4 * (float)bezier_basis0._2792_4_ + fVar7 * (float)bezier_basis0._3948_4_;
        auVar83._8_4_ =
             fVar12 * (float)bezier_basis0._484_4_ +
             fVar9 * (float)bezier_basis0._1640_4_ +
             fVar4 * (float)bezier_basis0._2796_4_ + fVar7 * (float)bezier_basis0._3952_4_;
        auVar83._12_4_ =
             fVar12 * (float)bezier_basis0._488_4_ +
             fVar9 * (float)bezier_basis0._1644_4_ +
             fVar4 * (float)bezier_basis0._2800_4_ + fVar7 * (float)bezier_basis0._3956_4_;
        auVar83._16_4_ =
             fVar12 * (float)bezier_basis0._492_4_ +
             fVar9 * (float)bezier_basis0._1648_4_ +
             fVar4 * (float)bezier_basis0._2804_4_ + fVar7 * (float)bezier_basis0._3960_4_;
        auVar83._20_4_ =
             fVar12 * (float)bezier_basis0._496_4_ +
             fVar9 * (float)bezier_basis0._1652_4_ +
             fVar4 * (float)bezier_basis0._2808_4_ + fVar7 * (float)bezier_basis0._3964_4_;
        auVar83._24_4_ =
             fVar12 * (float)bezier_basis0._500_4_ +
             fVar9 * (float)bezier_basis0._1656_4_ +
             fVar4 * (float)bezier_basis0._2812_4_ + fVar7 * (float)bezier_basis0._3968_4_;
        auVar83._28_4_ = fVar65 + fVar70;
        fVar65 = *(float *)(pcVar15 + lVar30 + 8);
        fVar40 = (float)bezier_basis0._476_4_ * fVar65 +
                 (float)bezier_basis0._1632_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2788_4_ + fVar8 * (float)bezier_basis0._3944_4_;
        fVar44 = (float)bezier_basis0._480_4_ * fVar65 +
                 (float)bezier_basis0._1636_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2792_4_ + fVar8 * (float)bezier_basis0._3948_4_;
        fVar46 = (float)bezier_basis0._484_4_ * fVar65 +
                 (float)bezier_basis0._1640_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2796_4_ + fVar8 * (float)bezier_basis0._3952_4_;
        fVar48 = (float)bezier_basis0._488_4_ * fVar65 +
                 (float)bezier_basis0._1644_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2800_4_ + fVar8 * (float)bezier_basis0._3956_4_;
        fVar50 = (float)bezier_basis0._492_4_ * fVar65 +
                 (float)bezier_basis0._1648_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2804_4_ + fVar8 * (float)bezier_basis0._3960_4_;
        fVar52 = (float)bezier_basis0._496_4_ * fVar65 +
                 (float)bezier_basis0._1652_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2808_4_ + fVar8 * (float)bezier_basis0._3964_4_;
        fVar54 = (float)bezier_basis0._500_4_ * fVar65 +
                 (float)bezier_basis0._1656_4_ * fVar10 +
                 fVar5 * (float)bezier_basis0._2812_4_ + fVar8 * (float)bezier_basis0._3968_4_;
        fVar70 = fVar70 + in_ZMM13._28_4_ + fVar80 + fVar8;
        auVar60 = vshufps_avx(ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar30 + 0xc))),
                              ZEXT416((uint)(fVar1 * *(float *)(pcVar15 + lVar30 + 0xc))),0);
        fVar1 = auVar60._0_4_;
        fVar80 = auVar60._4_4_;
        fVar23 = auVar60._8_4_;
        fVar41 = (float)bezier_basis0._476_4_ * fVar1 +
                 fVar86 * (float)bezier_basis0._1632_4_ +
                 fVar82 * (float)bezier_basis0._2788_4_ + fVar89 * (float)bezier_basis0._3944_4_;
        fVar45 = (float)bezier_basis0._480_4_ * fVar80 +
                 fVar87 * (float)bezier_basis0._1636_4_ +
                 fVar84 * (float)bezier_basis0._2792_4_ + fVar93 * (float)bezier_basis0._3948_4_;
        fVar47 = (float)bezier_basis0._484_4_ * fVar23 +
                 fVar88 * (float)bezier_basis0._1640_4_ +
                 fVar85 * (float)bezier_basis0._2796_4_ + fVar94 * (float)bezier_basis0._3952_4_;
        fVar49 = (float)bezier_basis0._488_4_ * auVar60._12_4_ +
                 auVar59._12_4_ * (float)bezier_basis0._1644_4_ +
                 auVar58._12_4_ * (float)bezier_basis0._2800_4_ +
                 auVar43._12_4_ * (float)bezier_basis0._3956_4_;
        fVar51 = (float)bezier_basis0._492_4_ * fVar1 +
                 fVar86 * (float)bezier_basis0._1648_4_ +
                 fVar82 * (float)bezier_basis0._2804_4_ + fVar89 * (float)bezier_basis0._3960_4_;
        fVar53 = (float)bezier_basis0._496_4_ * fVar80 +
                 fVar87 * (float)bezier_basis0._1652_4_ +
                 fVar84 * (float)bezier_basis0._2808_4_ + fVar93 * (float)bezier_basis0._3964_4_;
        fVar55 = (float)bezier_basis0._500_4_ * fVar23 +
                 fVar88 * (float)bezier_basis0._1656_4_ +
                 fVar85 * (float)bezier_basis0._2812_4_ + fVar94 * (float)bezier_basis0._3968_4_;
        fVar56 = (float)bezier_basis0._504_4_ +
                 (float)bezier_basis0._1660_4_ +
                 (float)bezier_basis0._2816_4_ + (float)bezier_basis0._3972_4_;
        fVar57 = (float)bezier_basis0._504_4_ + (float)bezier_basis0._504_4_ + fVar56;
        auVar64._0_4_ =
             fVar11 * (float)bezier_basis0._5100_4_ +
             (float)bezier_basis0._6256_4_ * fVar2 +
             (float)bezier_basis0._8568_4_ * fVar6 + (float)bezier_basis0._7412_4_ * fVar3;
        auVar64._4_4_ =
             fVar11 * (float)bezier_basis0._5104_4_ +
             (float)bezier_basis0._6260_4_ * fVar2 +
             (float)bezier_basis0._8572_4_ * fVar6 + (float)bezier_basis0._7416_4_ * fVar3;
        auVar64._8_4_ =
             fVar11 * (float)bezier_basis0._5108_4_ +
             (float)bezier_basis0._6264_4_ * fVar2 +
             (float)bezier_basis0._8576_4_ * fVar6 + (float)bezier_basis0._7420_4_ * fVar3;
        auVar64._12_4_ =
             fVar11 * (float)bezier_basis0._5112_4_ +
             (float)bezier_basis0._6268_4_ * fVar2 +
             (float)bezier_basis0._8580_4_ * fVar6 + (float)bezier_basis0._7424_4_ * fVar3;
        auVar64._16_4_ =
             fVar11 * (float)bezier_basis0._5116_4_ +
             (float)bezier_basis0._6272_4_ * fVar2 +
             (float)bezier_basis0._8584_4_ * fVar6 + (float)bezier_basis0._7428_4_ * fVar3;
        auVar64._20_4_ =
             fVar11 * (float)bezier_basis0._5120_4_ +
             (float)bezier_basis0._6276_4_ * fVar2 +
             (float)bezier_basis0._8588_4_ * fVar6 + (float)bezier_basis0._7432_4_ * fVar3;
        auVar64._24_4_ =
             fVar11 * (float)bezier_basis0._5124_4_ +
             (float)bezier_basis0._6280_4_ * fVar2 +
             (float)bezier_basis0._8592_4_ * fVar6 + (float)bezier_basis0._7436_4_ * fVar3;
        auVar64._28_4_ =
             (float)bezier_basis0._6284_4_ +
             (float)bezier_basis0._504_4_ +
             (float)bezier_basis0._504_4_ + (float)bezier_basis0._3972_4_;
        auVar66._0_4_ =
             fVar12 * (float)bezier_basis0._5100_4_ +
             fVar9 * (float)bezier_basis0._6256_4_ +
             (float)bezier_basis0._7412_4_ * fVar4 + (float)bezier_basis0._8568_4_ * fVar7;
        auVar66._4_4_ =
             fVar12 * (float)bezier_basis0._5104_4_ +
             fVar9 * (float)bezier_basis0._6260_4_ +
             (float)bezier_basis0._7416_4_ * fVar4 + (float)bezier_basis0._8572_4_ * fVar7;
        auVar66._8_4_ =
             fVar12 * (float)bezier_basis0._5108_4_ +
             fVar9 * (float)bezier_basis0._6264_4_ +
             (float)bezier_basis0._7420_4_ * fVar4 + (float)bezier_basis0._8576_4_ * fVar7;
        auVar66._12_4_ =
             fVar12 * (float)bezier_basis0._5112_4_ +
             fVar9 * (float)bezier_basis0._6268_4_ +
             (float)bezier_basis0._7424_4_ * fVar4 + (float)bezier_basis0._8580_4_ * fVar7;
        auVar66._16_4_ =
             fVar12 * (float)bezier_basis0._5116_4_ +
             fVar9 * (float)bezier_basis0._6272_4_ +
             (float)bezier_basis0._7428_4_ * fVar4 + (float)bezier_basis0._8584_4_ * fVar7;
        auVar66._20_4_ =
             fVar12 * (float)bezier_basis0._5120_4_ +
             fVar9 * (float)bezier_basis0._6276_4_ +
             (float)bezier_basis0._7432_4_ * fVar4 + (float)bezier_basis0._8588_4_ * fVar7;
        auVar66._24_4_ =
             fVar12 * (float)bezier_basis0._5124_4_ +
             fVar9 * (float)bezier_basis0._6280_4_ +
             (float)bezier_basis0._7436_4_ * fVar4 + (float)bezier_basis0._8592_4_ * fVar7;
        auVar66._28_4_ = (float)bezier_basis0._6284_4_ + fVar57;
        auVar77._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar65 +
             (float)bezier_basis0._6256_4_ * fVar10 +
             (float)bezier_basis0._7412_4_ * fVar5 + (float)bezier_basis0._8568_4_ * fVar8;
        auVar77._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar65 +
             (float)bezier_basis0._6260_4_ * fVar10 +
             (float)bezier_basis0._7416_4_ * fVar5 + (float)bezier_basis0._8572_4_ * fVar8;
        auVar77._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar65 +
             (float)bezier_basis0._6264_4_ * fVar10 +
             (float)bezier_basis0._7420_4_ * fVar5 + (float)bezier_basis0._8576_4_ * fVar8;
        auVar77._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar65 +
             (float)bezier_basis0._6268_4_ * fVar10 +
             (float)bezier_basis0._7424_4_ * fVar5 + (float)bezier_basis0._8580_4_ * fVar8;
        auVar77._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar65 +
             (float)bezier_basis0._6272_4_ * fVar10 +
             (float)bezier_basis0._7428_4_ * fVar5 + (float)bezier_basis0._8584_4_ * fVar8;
        auVar77._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar65 +
             (float)bezier_basis0._6276_4_ * fVar10 +
             (float)bezier_basis0._7432_4_ * fVar5 + (float)bezier_basis0._8588_4_ * fVar8;
        auVar77._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar65 +
             (float)bezier_basis0._6280_4_ * fVar10 +
             (float)bezier_basis0._7436_4_ * fVar5 + (float)bezier_basis0._8592_4_ * fVar8;
        auVar77._28_4_ = fVar57 + (float)bezier_basis0._504_4_ + fVar2 + 0.0;
        auVar61._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar1 +
             fVar86 * (float)bezier_basis0._6256_4_ +
             (float)bezier_basis0._7412_4_ * fVar82 + fVar89 * (float)bezier_basis0._8568_4_;
        auVar61._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar80 +
             fVar87 * (float)bezier_basis0._6260_4_ +
             (float)bezier_basis0._7416_4_ * fVar84 + fVar93 * (float)bezier_basis0._8572_4_;
        auVar61._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar23 +
             fVar88 * (float)bezier_basis0._6264_4_ +
             (float)bezier_basis0._7420_4_ * fVar85 + fVar94 * (float)bezier_basis0._8576_4_;
        auVar61._12_4_ =
             (float)bezier_basis0._5112_4_ * auVar60._12_4_ +
             auVar59._12_4_ * (float)bezier_basis0._6268_4_ +
             (float)bezier_basis0._7424_4_ * auVar58._12_4_ +
             auVar43._12_4_ * (float)bezier_basis0._8580_4_;
        auVar61._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar1 +
             fVar86 * (float)bezier_basis0._6272_4_ +
             (float)bezier_basis0._7428_4_ * fVar82 + fVar89 * (float)bezier_basis0._8584_4_;
        auVar61._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar80 +
             fVar87 * (float)bezier_basis0._6276_4_ +
             (float)bezier_basis0._7432_4_ * fVar84 + fVar93 * (float)bezier_basis0._8588_4_;
        auVar61._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar23 +
             fVar88 * (float)bezier_basis0._6280_4_ +
             (float)bezier_basis0._7436_4_ * fVar85 + fVar94 * (float)bezier_basis0._8592_4_;
        auVar61._28_4_ =
             fVar57 + (float)bezier_basis0._6284_4_ +
                      (float)bezier_basis0._7440_4_ + (float)bezier_basis0._8596_4_;
        auVar17 = vblendps_avx(auVar64,ZEXT832(0) << 0x20,1);
        auVar18 = vblendps_avx(auVar66,ZEXT832(0) << 0x20,1);
        auVar62 = ZEXT832(0) << 0x20;
        auVar19 = vblendps_avx(auVar77,auVar62,1);
        auVar20 = vblendps_avx(auVar61,auVar62,1);
        auVar24._4_4_ = auVar17._4_4_ * 0.055555556;
        auVar24._0_4_ = auVar17._0_4_ * 0.055555556;
        auVar24._8_4_ = auVar17._8_4_ * 0.055555556;
        auVar24._12_4_ = auVar17._12_4_ * 0.055555556;
        auVar24._16_4_ = auVar17._16_4_ * 0.055555556;
        auVar24._20_4_ = auVar17._20_4_ * 0.055555556;
        auVar24._24_4_ = auVar17._24_4_ * 0.055555556;
        auVar24._28_4_ = auVar17._28_4_;
        auVar17._4_4_ = auVar18._4_4_ * 0.055555556;
        auVar17._0_4_ = auVar18._0_4_ * 0.055555556;
        auVar17._8_4_ = auVar18._8_4_ * 0.055555556;
        auVar17._12_4_ = auVar18._12_4_ * 0.055555556;
        auVar17._16_4_ = auVar18._16_4_ * 0.055555556;
        auVar17._20_4_ = auVar18._20_4_ * 0.055555556;
        auVar17._24_4_ = auVar18._24_4_ * 0.055555556;
        auVar17._28_4_ = auVar18._28_4_;
        auVar18._4_4_ = auVar19._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar19._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar19._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar19._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar19._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar19._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar19._24_4_ * 0.055555556;
        auVar18._28_4_ = bezier_basis0._5128_4_;
        auVar19._4_4_ = auVar20._4_4_ * 0.055555556;
        auVar19._0_4_ = auVar20._0_4_ * 0.055555556;
        auVar19._8_4_ = auVar20._8_4_ * 0.055555556;
        auVar19._12_4_ = auVar20._12_4_ * 0.055555556;
        auVar19._16_4_ = auVar20._16_4_ * 0.055555556;
        auVar19._20_4_ = auVar20._20_4_ * 0.055555556;
        auVar19._24_4_ = auVar20._24_4_ * 0.055555556;
        auVar19._28_4_ = auVar20._28_4_;
        auVar24 = vsubps_avx(auVar90,auVar24);
        auVar25 = vsubps_avx(auVar83,auVar17);
        auVar29._4_4_ = fVar44;
        auVar29._0_4_ = fVar40;
        auVar29._8_4_ = fVar46;
        auVar29._12_4_ = fVar48;
        auVar29._16_4_ = fVar50;
        auVar29._20_4_ = fVar52;
        auVar29._24_4_ = fVar54;
        auVar29._28_4_ = fVar70;
        auVar26 = vsubps_avx(auVar29,auVar18);
        auVar28._4_4_ = fVar45;
        auVar28._0_4_ = fVar41;
        auVar28._8_4_ = fVar47;
        auVar28._12_4_ = fVar49;
        auVar28._16_4_ = fVar51;
        auVar28._20_4_ = fVar53;
        auVar28._24_4_ = fVar55;
        auVar28._28_4_ = fVar56;
        auVar27 = vsubps_avx(auVar28,auVar19);
        auVar17 = vblendps_avx(auVar64,auVar62,0x80);
        auVar18 = vblendps_avx(auVar66,auVar62,0x80);
        auVar19 = vblendps_avx(auVar77,ZEXT832(0) << 0x20,0x80);
        auVar20 = vblendps_avx(auVar61,ZEXT832(0) << 0x20,0x80);
        auVar74._0_4_ = auVar90._0_4_ + auVar17._0_4_ * 0.055555556;
        auVar74._4_4_ = auVar90._4_4_ + auVar17._4_4_ * 0.055555556;
        auVar74._8_4_ = auVar90._8_4_ + auVar17._8_4_ * 0.055555556;
        auVar74._12_4_ = auVar90._12_4_ + auVar17._12_4_ * 0.055555556;
        auVar74._16_4_ = auVar90._16_4_ + auVar17._16_4_ * 0.055555556;
        auVar74._20_4_ = auVar90._20_4_ + auVar17._20_4_ * 0.055555556;
        auVar74._24_4_ = auVar90._24_4_ + auVar17._24_4_ * 0.055555556;
        auVar74._28_4_ = auVar90._28_4_ + auVar17._28_4_;
        auVar67._0_4_ = auVar83._0_4_ + auVar18._0_4_ * 0.055555556;
        auVar67._4_4_ = auVar83._4_4_ + auVar18._4_4_ * 0.055555556;
        auVar67._8_4_ = auVar83._8_4_ + auVar18._8_4_ * 0.055555556;
        auVar67._12_4_ = auVar83._12_4_ + auVar18._12_4_ * 0.055555556;
        auVar67._16_4_ = auVar83._16_4_ + auVar18._16_4_ * 0.055555556;
        auVar67._20_4_ = auVar83._20_4_ + auVar18._20_4_ * 0.055555556;
        auVar67._24_4_ = auVar83._24_4_ + auVar18._24_4_ * 0.055555556;
        auVar67._28_4_ = auVar83._28_4_ + auVar18._28_4_;
        auVar78._0_4_ = fVar40 + auVar19._0_4_ * 0.055555556;
        auVar78._4_4_ = fVar44 + auVar19._4_4_ * 0.055555556;
        auVar78._8_4_ = fVar46 + auVar19._8_4_ * 0.055555556;
        auVar78._12_4_ = fVar48 + auVar19._12_4_ * 0.055555556;
        auVar78._16_4_ = fVar50 + auVar19._16_4_ * 0.055555556;
        auVar78._20_4_ = fVar52 + auVar19._20_4_ * 0.055555556;
        auVar78._24_4_ = fVar54 + auVar19._24_4_ * 0.055555556;
        auVar78._28_4_ = fVar70 + auVar19._28_4_;
        auVar62._0_4_ = fVar41 + auVar20._0_4_ * 0.055555556;
        auVar62._4_4_ = fVar45 + auVar20._4_4_ * 0.055555556;
        auVar62._8_4_ = fVar47 + auVar20._8_4_ * 0.055555556;
        auVar62._12_4_ = fVar49 + auVar20._12_4_ * 0.055555556;
        auVar62._16_4_ = fVar51 + auVar20._16_4_ * 0.055555556;
        auVar62._20_4_ = fVar53 + auVar20._20_4_ * 0.055555556;
        auVar62._24_4_ = fVar55 + auVar20._24_4_ * 0.055555556;
        auVar62._28_4_ = fVar56 + auVar20._28_4_;
        auVar91._8_4_ = 0x7f800000;
        auVar91._0_8_ = 0x7f8000007f800000;
        auVar91._12_4_ = 0x7f800000;
        auVar91._16_4_ = 0x7f800000;
        auVar91._20_4_ = 0x7f800000;
        auVar91._24_4_ = 0x7f800000;
        auVar91._28_4_ = 0x7f800000;
        auVar17 = vminps_avx(auVar91,auVar90);
        auVar18 = vminps_avx(auVar91,auVar83);
        auVar19 = vminps_avx(auVar91,auVar29);
        auVar20 = vminps_avx(auVar24,auVar74);
        auVar61 = vminps_avx(auVar17,auVar20);
        in_ZMM13 = ZEXT3264(auVar61);
        auVar17 = vminps_avx(auVar25,auVar67);
        auVar64 = vminps_avx(auVar18,auVar17);
        auVar17 = vminps_avx(auVar26,auVar78);
        auVar66 = vminps_avx(auVar19,auVar17);
        auVar17 = vminps_avx(auVar91,auVar28);
        auVar18 = vminps_avx(auVar27,auVar62);
        auVar77 = vminps_avx(auVar17,auVar18);
        auVar17 = vmaxps_avx(auVar24,auVar74);
        auVar92._8_4_ = 0xff800000;
        auVar92._0_8_ = 0xff800000ff800000;
        auVar92._12_4_ = 0xff800000;
        auVar92._16_4_ = 0xff800000;
        auVar92._20_4_ = 0xff800000;
        auVar92._24_4_ = 0xff800000;
        auVar92._28_4_ = 0xff800000;
        auVar18 = vmaxps_avx(auVar92,auVar90);
        auVar17 = vmaxps_avx(auVar18,auVar17);
        auVar18 = vmaxps_avx(auVar25,auVar67);
        auVar19 = vmaxps_avx(auVar92,auVar83);
        auVar18 = vmaxps_avx(auVar19,auVar18);
        auVar19 = vmaxps_avx(auVar26,auVar78);
        auVar20 = vmaxps_avx(auVar92,auVar29);
        auVar19 = vmaxps_avx(auVar20,auVar19);
        auVar20 = vmaxps_avx(auVar27,auVar62);
        auVar24 = vmaxps_avx(auVar92,auVar28);
        auVar20 = vmaxps_avx(auVar24,auVar20);
        auVar24 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar24 = vminps_avx(auVar61,auVar24);
        auVar61 = vshufpd_avx(auVar24,auVar24,5);
        auVar24 = vminps_avx(auVar24,auVar61);
        auVar58 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
        auVar24 = vshufps_avx(auVar64,auVar64,0xb1);
        auVar24 = vminps_avx(auVar64,auVar24);
        auVar61 = vshufpd_avx(auVar24,auVar24,5);
        auVar24 = vminps_avx(auVar24,auVar61);
        auVar43 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
        auVar43 = vunpcklps_avx(auVar58,auVar43);
        auVar24 = vshufps_avx(auVar66,auVar66,0xb1);
        auVar24 = vminps_avx(auVar66,auVar24);
        auVar61 = vshufpd_avx(auVar24,auVar24,5);
        auVar24 = vminps_avx(auVar24,auVar61);
        auVar58 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
        auVar59 = vinsertps_avx(auVar43,auVar58,0x28);
        auVar24 = vshufps_avx(auVar17,auVar17,0xb1);
        auVar17 = vmaxps_avx(auVar17,auVar24);
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar72 = ZEXT1664(auVar71);
        auVar24 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vmaxps_avx(auVar17,auVar24);
        auVar58 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
        auVar17 = vshufps_avx(auVar18,auVar18,0xb1);
        auVar17 = vmaxps_avx(auVar18,auVar17);
        auVar18 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vmaxps_avx(auVar17,auVar18);
        auVar43 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
        auVar43 = vunpcklps_avx(auVar58,auVar43);
        auVar17 = vshufps_avx(auVar19,auVar19,0xb1);
        auVar17 = vmaxps_avx(auVar19,auVar17);
        auVar18 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vmaxps_avx(auVar17,auVar18);
        auVar58 = vmaxps_avx(auVar17._0_16_,auVar17._16_16_);
        auVar60 = vinsertps_avx(auVar43,auVar58,0x28);
        auVar17 = vshufps_avx(auVar77,auVar77,0xb1);
        auVar17 = vminps_avx(auVar77,auVar17);
        auVar81 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        auVar18 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar58 = vminss_avx(auVar17._0_16_,auVar17._16_16_);
        auVar17 = vshufps_avx(auVar20,auVar20,0xb1);
        auVar17 = vmaxps_avx(auVar20,auVar17);
        auVar18 = vshufpd_avx(auVar17,auVar17,5);
        auVar17 = vmaxps_avx(auVar17,auVar18);
        auVar43 = vmaxss_avx(auVar17._0_16_,auVar17._16_16_);
        auVar58 = vandps_avx(auVar58,auVar71);
        auVar43 = vandps_avx(auVar43,auVar71);
        auVar58 = vmaxss_avx(auVar43,auVar58);
        auVar58 = vshufps_avx(auVar58,auVar58,0);
        auVar59 = vsubps_avx(auVar59,auVar58);
        auVar42._0_4_ = auVar60._0_4_ + auVar58._0_4_;
        auVar42._4_4_ = auVar60._4_4_ + auVar58._4_4_;
        auVar42._8_4_ = auVar60._8_4_ + auVar58._8_4_;
        auVar42._12_4_ = auVar60._12_4_ + auVar58._12_4_;
        auVar58 = vandps_avx(auVar59,auVar71);
        auVar43 = vandps_avx(auVar42,auVar71);
        auVar58 = vmaxps_avx(auVar58,auVar43);
        auVar43 = vmovshdup_avx(auVar58);
        auVar43 = vmaxss_avx(auVar43,auVar58);
        auVar58 = vshufpd_avx(auVar58,auVar58,1);
        auVar58 = vmaxss_avx(auVar58,auVar43);
        auVar58 = ZEXT416((uint)(auVar58._0_4_ * 4.7683716e-07));
        auVar58 = vshufps_avx(auVar58,auVar58,0);
        auVar43 = vsubps_avx(auVar59,auVar58);
        aVar21 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar43,ZEXT416(geomID),0x30);
        auVar43._0_4_ = auVar42._0_4_ + auVar58._0_4_;
        auVar43._4_4_ = auVar42._4_4_ + auVar58._4_4_;
        auVar43._8_4_ = auVar42._8_4_ + auVar58._8_4_;
        auVar43._12_4_ = auVar42._12_4_ + auVar58._12_4_;
        aVar22 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar43,ZEXT416((uint)uVar35),0x30);
        auVar59._0_4_ = aVar21.x + aVar22.x;
        auVar59._4_4_ = aVar21.y + aVar22.y;
        auVar59._8_4_ = aVar21.z + aVar22.z;
        auVar59._12_4_ = aVar21.field_3.w + aVar22.field_3.w;
        auVar58 = vminps_avx(auVar79._0_16_,auVar59);
        auVar79 = ZEXT1664(auVar58);
        auVar58 = vmaxps_avx(auVar75._0_16_,auVar59);
        auVar75 = ZEXT1664(auVar58);
        auVar58 = vmaxps_avx(auVar69._0_16_,(undefined1  [16])aVar22);
        auVar69 = ZEXT1664(auVar58);
        prims[local_228].upper.field_0.field_1 = aVar22;
        local_218 = vminps_avx(local_218,(undefined1  [16])aVar21);
        prims[local_228].lower.field_0.field_1 = aVar21;
        auVar63 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        local_240 = local_240 + 1;
        local_228 = local_228 + 1;
      }
LAB_012d47eb:
      aVar73 = auVar75._0_16_;
      aVar76 = auVar79._0_16_;
      aVar68 = auVar69._0_16_;
      uVar35 = uVar35 + 1;
    } while (uVar35 < r->_end);
  }
  else {
    aVar76.m128[2] = INFINITY;
    aVar76._0_8_ = 0x7f8000007f800000;
    aVar76.m128[3] = INFINITY;
    aVar73 = aVar68;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_218._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_218._8_8_;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar68;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar76;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar73;
  __return_storage_ptr__->end = local_240;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }